

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

int FindNode(sockaddr_in *address)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  in_addr *piVar4;
  
  uVar3 = 0;
  uVar2 = 0;
  if (0 < doomcom.numnodes) {
    uVar2 = (ulong)(uint)(int)doomcom.numnodes;
  }
  piVar4 = &sendaddress[0].sin_addr;
  do {
    if (uVar2 == uVar3) {
LAB_00465bda:
      uVar1 = 0xffffffff;
      if ((uint)uVar2 != (int)doomcom.numnodes) {
        uVar1 = (uint)uVar2;
      }
      return uVar1;
    }
    if (((address->sin_addr).s_addr == piVar4->s_addr) &&
       (address->sin_port == ((sockaddr_in *)(piVar4 + -1))->sin_port)) {
      uVar2 = uVar3 & 0xffffffff;
      goto LAB_00465bda;
    }
    uVar3 = uVar3 + 1;
    piVar4 = piVar4 + 4;
  } while( true );
}

Assistant:

int FindNode (const sockaddr_in *address)
{
	int i;

	// find remote node number
	for (i = 0; i<doomcom.numnodes; i++)
		if (address->sin_addr.s_addr == sendaddress[i].sin_addr.s_addr
			&& address->sin_port == sendaddress[i].sin_port)
			break;

	if (i == doomcom.numnodes)
	{
		// packet is not from one of the players (new game broadcast?)
		i = -1;
	}
	return i;
}